

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coroutine.cpp
# Opt level: O3

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  long *plVar3;
  Coroutine co;
  VMStd vm;
  Coroutine local_d8;
  string local_c0;
  VM local_a0;
  Coroutine local_48;
  
  squall::VMStd::VMStd((VMStd *)&local_a0,0x400);
  squall::VMStd::dofile((VMStd *)&local_a0,"coroutine.nut");
  paVar1 = &local_c0.field_2;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"bar","");
  squall::TableBase::co_call<int,int,int,int>
            (&local_48,
             (TableBase *)
             local_a0.root_table_._M_t.
             super___uniq_ptr_impl<squall::TableBase,_std::default_delete<squall::TableBase>_>._M_t.
             super__Tuple_impl<0UL,_squall::TableBase_*,_std::default_delete<squall::TableBase>_>.
             super__Head_base<0UL,_squall::TableBase_*,_false>._M_head_impl,&local_c0,1,2,3,4);
  squall::Coroutine::~Coroutine(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"zot","");
  squall::TableBase::co_call<>
            (&local_d8,
             (TableBase *)
             local_a0.root_table_._M_t.
             super___uniq_ptr_impl<squall::TableBase,_std::default_delete<squall::TableBase>_>._M_t.
             super__Tuple_impl<0UL,_squall::TableBase_*,_std::default_delete<squall::TableBase>_>.
             super__Head_base<0UL,_squall::TableBase_*,_false>._M_head_impl,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  while( true ) {
    squall::Coroutine::validate_vm(&local_d8);
    if (local_d8.suspended_ != true) break;
    squall::Coroutine::resume(&local_d8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"**** zot result: ",0x11)
  ;
  iVar2 = squall::Coroutine::result<int>(&local_d8);
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  squall::Coroutine::~Coroutine(&local_d8);
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"baz","");
  squall::TableBase::co_call<>
            (&local_d8,
             (TableBase *)
             local_a0.root_table_._M_t.
             super___uniq_ptr_impl<squall::TableBase,_std::default_delete<squall::TableBase>_>._M_t.
             super__Tuple_impl<0UL,_squall::TableBase_*,_std::default_delete<squall::TableBase>_>.
             super__Head_base<0UL,_squall::TableBase_*,_false>._M_head_impl,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  while( true ) {
    squall::Coroutine::validate_vm(&local_d8);
    if (local_d8.suspended_ != true) break;
    iVar2 = squall::Coroutine::yielded<int>(&local_d8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"**** baz yielded: ",0x12);
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    squall::Coroutine::resume(&local_d8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"**** baz result: ",0x11)
  ;
  iVar2 = squall::Coroutine::result<int>(&local_d8);
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  squall::Coroutine::~Coroutine(&local_d8);
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"foo","");
  squall::TableBase::co_call<>
            (&local_d8,
             (TableBase *)
             local_a0.root_table_._M_t.
             super___uniq_ptr_impl<squall::TableBase,_std::default_delete<squall::TableBase>_>._M_t.
             super__Tuple_impl<0UL,_squall::TableBase_*,_std::default_delete<squall::TableBase>_>.
             super__Head_base<0UL,_squall::TableBase_*,_false>._M_head_impl,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  while( true ) {
    squall::Coroutine::validate_vm(&local_d8);
    if (local_d8.suspended_ != true) break;
    iVar2 = squall::Coroutine::yielded<int>(&local_d8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"**** foo yielded: ",0x12);
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    squall::Coroutine::resume<int>(&local_d8,iVar2 * 2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"**** foo result: ",0x11)
  ;
  iVar2 = squall::Coroutine::result<int>(&local_d8);
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  squall::Coroutine::~Coroutine(&local_d8);
  squall::VM::~VM(&local_a0);
  return 0;
}

Assistant:

int main() {
    try {
        squall::VMStd vm;
        vm.dofile("coroutine.nut");

        vm.co_call("bar", 1, 2, 3, 4);

        {
            auto co = vm.co_call("zot");
            while (co.suspended()) {
                co.resume();
            }
            std::cerr << "**** zot result: " << co.result<int>() << std::endl;
        }

        {
            auto co = vm.co_call("baz");
            while (co.suspended()) {
                int n = co.yielded<int>();
                std::cerr << "**** baz yielded: " << n << std::endl;
                co.resume();
            }
            std::cerr << "**** baz result: " << co.result<int>() << std::endl;
        }

        {
            auto co = vm.co_call("foo");
            while (co.suspended()) {
                int n = co.yielded<int>();
                std::cerr << "**** foo yielded: " << n << std::endl;
                co.resume(n*2);
            }
            std::cerr << "**** foo result: " << co.result<int>() << std::endl;
        }
    }
    catch(squall::squirrel_error& e) {
        std::cerr << e.what() << std::endl;
    }

    return 0;
}